

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O3

void __thiscall script_tests::compute_tapleaf::test_method(compute_tapleaf *this)

{
  long lVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  Span<const_unsigned_char> script_00;
  Span<const_unsigned_char> script_01;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  lazy_ostream local_158;
  undefined1 *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  uint256 *local_118;
  undefined **local_110;
  undefined1 local_108;
  undefined1 *local_100;
  uint256 **local_f8;
  uint256 *local_f0;
  undefined **local_e8;
  undefined1 local_e0;
  undefined1 *local_d8;
  uint256 **local_d0;
  char *local_c8;
  char *local_c0;
  assertion_result local_b8;
  uint8_t script [6];
  uint256 local_98;
  uint256 tlc2;
  uint256 tlc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  builtin_memcpy(script,"foobar",6);
  tlc0.super_base_blob<256U>.m_data._M_elems[0x10] = '{';
  tlc0.super_base_blob<256U>.m_data._M_elems[0x11] = '\x02';
  tlc0.super_base_blob<256U>.m_data._M_elems[0x12] = 0xb9;
  tlc0.super_base_blob<256U>.m_data._M_elems[0x13] = '\x05';
  tlc0.super_base_blob<256U>.m_data._M_elems[0x14] = 0xd6;
  tlc0.super_base_blob<256U>.m_data._M_elems[0x15] = '\x11';
  tlc0.super_base_blob<256U>.m_data._M_elems[0x16] = 0xcc;
  tlc0.super_base_blob<256U>.m_data._M_elems[0x17] = 0xcd;
  tlc0.super_base_blob<256U>.m_data._M_elems[0x18] = ']';
  tlc0.super_base_blob<256U>.m_data._M_elems[0x19] = '!';
  tlc0.super_base_blob<256U>.m_data._M_elems[0x1a] = 0xa1;
  tlc0.super_base_blob<256U>.m_data._M_elems[0x1b] = 'r';
  tlc0.super_base_blob<256U>.m_data._M_elems[0x1c] = 0xc2;
  tlc0.super_base_blob<256U>.m_data._M_elems[0x1d] = '\x10';
  tlc0.super_base_blob<256U>.m_data._M_elems[0x1e] = 0xbc;
  tlc0.super_base_blob<256U>.m_data._M_elems[0x1f] = 0xed;
  tlc0.super_base_blob<256U>.m_data._M_elems[0] = '\x06';
  tlc0.super_base_blob<256U>.m_data._M_elems[1] = 0x9c;
  tlc0.super_base_blob<256U>.m_data._M_elems[2] = '[';
  tlc0.super_base_blob<256U>.m_data._M_elems[3] = '{';
  tlc0.super_base_blob<256U>.m_data._M_elems[4] = 'v';
  tlc0.super_base_blob<256U>.m_data._M_elems[5] = '6';
  tlc0.super_base_blob<256U>.m_data._M_elems[6] = 0xf1;
  tlc0.super_base_blob<256U>.m_data._M_elems[7] = '\x03';
  tlc0.super_base_blob<256U>.m_data._M_elems[8] = '\x12';
  tlc0.super_base_blob<256U>.m_data._M_elems[9] = 'R';
  tlc0.super_base_blob<256U>.m_data._M_elems[10] = 'E';
  tlc0.super_base_blob<256U>.m_data._M_elems[0xb] = 0xcd;
  tlc0.super_base_blob<256U>.m_data._M_elems[0xc] = 0x97;
  tlc0.super_base_blob<256U>.m_data._M_elems[0xd] = 0xed;
  tlc0.super_base_blob<256U>.m_data._M_elems[0xe] = 0xd6;
  tlc0.super_base_blob<256U>.m_data._M_elems[0xf] = 'Z';
  tlc2.super_base_blob<256U>.m_data._M_elems[0x10] = 0xf0;
  tlc2.super_base_blob<256U>.m_data._M_elems[0x11] = 0x9d;
  tlc2.super_base_blob<256U>.m_data._M_elems[0x12] = 0xa5;
  tlc2.super_base_blob<256U>.m_data._M_elems[0x13] = 0xd8;
  tlc2.super_base_blob<256U>.m_data._M_elems[0x14] = 0xf5;
  tlc2.super_base_blob<256U>.m_data._M_elems[0x15] = 0xbe;
  tlc2.super_base_blob<256U>.m_data._M_elems[0x16] = 0x9d;
  tlc2.super_base_blob<256U>.m_data._M_elems[0x17] = '%';
  tlc2.super_base_blob<256U>.m_data._M_elems[0x18] = 'n';
  tlc2.super_base_blob<256U>.m_data._M_elems[0x19] = 0xf7;
  tlc2.super_base_blob<256U>.m_data._M_elems[0x1a] = 'k';
  tlc2.super_base_blob<256U>.m_data._M_elems[0x1b] = 0xae;
  tlc2.super_base_blob<256U>.m_data._M_elems[0x1c] = 0x90;
  tlc2.super_base_blob<256U>.m_data._M_elems[0x1d] = 'O';
  tlc2.super_base_blob<256U>.m_data._M_elems[0x1e] = '\\';
  tlc2.super_base_blob<256U>.m_data._M_elems[0x1f] = 0x8b;
  tlc2.super_base_blob<256U>.m_data._M_elems[0] = 'z';
  tlc2.super_base_blob<256U>.m_data._M_elems[1] = 0xb2;
  tlc2.super_base_blob<256U>.m_data._M_elems[2] = 'Q';
  tlc2.super_base_blob<256U>.m_data._M_elems[3] = 'd';
  tlc2.super_base_blob<256U>.m_data._M_elems[4] = 0xa7;
  tlc2.super_base_blob<256U>.m_data._M_elems[5] = 0xec;
  tlc2.super_base_blob<256U>.m_data._M_elems[6] = '%';
  tlc2.super_base_blob<256U>.m_data._M_elems[7] = '\x1b';
  tlc2.super_base_blob<256U>.m_data._M_elems[8] = 't';
  tlc2.super_base_blob<256U>.m_data._M_elems[9] = 'c';
  tlc2.super_base_blob<256U>.m_data._M_elems[10] = 0x92;
  tlc2.super_base_blob<256U>.m_data._M_elems[0xb] = 0xb5;
  tlc2.super_base_blob<256U>.m_data._M_elems[0xc] = 0x91;
  tlc2.super_base_blob<256U>.m_data._M_elems[0xd] = 0xc3;
  tlc2.super_base_blob<256U>.m_data._M_elems[0xe] = 'Y';
  tlc2.super_base_blob<256U>.m_data._M_elems[0xf] = 'c';
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x6bc;
  file.m_begin = (iterator)&local_128;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_138,msg);
  local_158.m_empty = false;
  local_158._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_148 = boost::unit_test::lazy_ostream::inst;
  local_140 = "";
  script_00.m_size = 6;
  script_00.m_data = script;
  ComputeTapleafHash(&local_98,0xc0,script_00);
  local_118 = &tlc0;
  auVar6[0] = -(local_98.super_base_blob<256U>.m_data._M_elems[0x10] ==
               tlc0.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar6[1] = -(local_98.super_base_blob<256U>.m_data._M_elems[0x11] ==
               tlc0.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar6[2] = -(local_98.super_base_blob<256U>.m_data._M_elems[0x12] ==
               tlc0.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar6[3] = -(local_98.super_base_blob<256U>.m_data._M_elems[0x13] ==
               tlc0.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar6[4] = -(local_98.super_base_blob<256U>.m_data._M_elems[0x14] ==
               tlc0.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar6[5] = -(local_98.super_base_blob<256U>.m_data._M_elems[0x15] ==
               tlc0.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar6[6] = -(local_98.super_base_blob<256U>.m_data._M_elems[0x16] ==
               tlc0.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar6[7] = -(local_98.super_base_blob<256U>.m_data._M_elems[0x17] ==
               tlc0.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar6[8] = -(local_98.super_base_blob<256U>.m_data._M_elems[0x18] ==
               tlc0.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar6[9] = -(local_98.super_base_blob<256U>.m_data._M_elems[0x19] ==
               tlc0.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar6[10] = -(local_98.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                tlc0.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar6[0xb] = -(local_98.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                 tlc0.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar6[0xc] = -(local_98.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                 tlc0.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar6[0xd] = -(local_98.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                 tlc0.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar6[0xe] = -(local_98.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                 tlc0.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar6[0xf] = -(local_98.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                 tlc0.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar4[0] = -(local_98.super_base_blob<256U>.m_data._M_elems[0] ==
               tlc0.super_base_blob<256U>.m_data._M_elems[0]);
  auVar4[1] = -(local_98.super_base_blob<256U>.m_data._M_elems[1] ==
               tlc0.super_base_blob<256U>.m_data._M_elems[1]);
  auVar4[2] = -(local_98.super_base_blob<256U>.m_data._M_elems[2] ==
               tlc0.super_base_blob<256U>.m_data._M_elems[2]);
  auVar4[3] = -(local_98.super_base_blob<256U>.m_data._M_elems[3] ==
               tlc0.super_base_blob<256U>.m_data._M_elems[3]);
  auVar4[4] = -(local_98.super_base_blob<256U>.m_data._M_elems[4] ==
               tlc0.super_base_blob<256U>.m_data._M_elems[4]);
  auVar4[5] = -(local_98.super_base_blob<256U>.m_data._M_elems[5] ==
               tlc0.super_base_blob<256U>.m_data._M_elems[5]);
  auVar4[6] = -(local_98.super_base_blob<256U>.m_data._M_elems[6] ==
               tlc0.super_base_blob<256U>.m_data._M_elems[6]);
  auVar4[7] = -(local_98.super_base_blob<256U>.m_data._M_elems[7] ==
               tlc0.super_base_blob<256U>.m_data._M_elems[7]);
  auVar4[8] = -(local_98.super_base_blob<256U>.m_data._M_elems[8] ==
               tlc0.super_base_blob<256U>.m_data._M_elems[8]);
  auVar4[9] = -(local_98.super_base_blob<256U>.m_data._M_elems[9] ==
               tlc0.super_base_blob<256U>.m_data._M_elems[9]);
  auVar4[10] = -(local_98.super_base_blob<256U>.m_data._M_elems[10] ==
                tlc0.super_base_blob<256U>.m_data._M_elems[10]);
  auVar4[0xb] = -(local_98.super_base_blob<256U>.m_data._M_elems[0xb] ==
                 tlc0.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar4[0xc] = -(local_98.super_base_blob<256U>.m_data._M_elems[0xc] ==
                 tlc0.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar4[0xd] = -(local_98.super_base_blob<256U>.m_data._M_elems[0xd] ==
                 tlc0.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar4[0xe] = -(local_98.super_base_blob<256U>.m_data._M_elems[0xe] ==
                 tlc0.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar4[0xf] = -(local_98.super_base_blob<256U>.m_data._M_elems[0xf] ==
                 tlc0.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar4 = auVar4 & auVar6;
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) == 0xffff);
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_c0 = "";
  local_d0 = &local_f0;
  local_e0 = 0;
  local_e8 = &PTR__lazy_ostream_01389a00;
  local_d8 = boost::unit_test::lazy_ostream::inst;
  local_f8 = &local_118;
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_01389a00;
  local_100 = boost::unit_test::lazy_ostream::inst;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_f0 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_158,1,2,REQUIRE,0xeb07c4,(size_t)&local_c8,0x6bc,&local_e8,"tlc0",
             &local_110);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x6bd;
  file_00.m_begin = (iterator)&local_168;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_178,
             msg_00);
  local_158.m_empty = false;
  local_158._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_148 = boost::unit_test::lazy_ostream::inst;
  local_140 = "";
  script_01.m_size = 6;
  script_01.m_data = script;
  ComputeTapleafHash(&local_98,0xc2,script_01);
  local_118 = &tlc2;
  auVar7[0] = -(local_98.super_base_blob<256U>.m_data._M_elems[0x10] ==
               tlc2.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar7[1] = -(local_98.super_base_blob<256U>.m_data._M_elems[0x11] ==
               tlc2.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar7[2] = -(local_98.super_base_blob<256U>.m_data._M_elems[0x12] ==
               tlc2.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar7[3] = -(local_98.super_base_blob<256U>.m_data._M_elems[0x13] ==
               tlc2.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar7[4] = -(local_98.super_base_blob<256U>.m_data._M_elems[0x14] ==
               tlc2.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar7[5] = -(local_98.super_base_blob<256U>.m_data._M_elems[0x15] ==
               tlc2.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar7[6] = -(local_98.super_base_blob<256U>.m_data._M_elems[0x16] ==
               tlc2.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar7[7] = -(local_98.super_base_blob<256U>.m_data._M_elems[0x17] ==
               tlc2.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar7[8] = -(local_98.super_base_blob<256U>.m_data._M_elems[0x18] ==
               tlc2.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar7[9] = -(local_98.super_base_blob<256U>.m_data._M_elems[0x19] ==
               tlc2.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar7[10] = -(local_98.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                tlc2.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar7[0xb] = -(local_98.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                 tlc2.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar7[0xc] = -(local_98.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                 tlc2.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar7[0xd] = -(local_98.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                 tlc2.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar7[0xe] = -(local_98.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                 tlc2.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar7[0xf] = -(local_98.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                 tlc2.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar5[0] = -(local_98.super_base_blob<256U>.m_data._M_elems[0] ==
               tlc2.super_base_blob<256U>.m_data._M_elems[0]);
  auVar5[1] = -(local_98.super_base_blob<256U>.m_data._M_elems[1] ==
               tlc2.super_base_blob<256U>.m_data._M_elems[1]);
  auVar5[2] = -(local_98.super_base_blob<256U>.m_data._M_elems[2] ==
               tlc2.super_base_blob<256U>.m_data._M_elems[2]);
  auVar5[3] = -(local_98.super_base_blob<256U>.m_data._M_elems[3] ==
               tlc2.super_base_blob<256U>.m_data._M_elems[3]);
  auVar5[4] = -(local_98.super_base_blob<256U>.m_data._M_elems[4] ==
               tlc2.super_base_blob<256U>.m_data._M_elems[4]);
  auVar5[5] = -(local_98.super_base_blob<256U>.m_data._M_elems[5] ==
               tlc2.super_base_blob<256U>.m_data._M_elems[5]);
  auVar5[6] = -(local_98.super_base_blob<256U>.m_data._M_elems[6] ==
               tlc2.super_base_blob<256U>.m_data._M_elems[6]);
  auVar5[7] = -(local_98.super_base_blob<256U>.m_data._M_elems[7] ==
               tlc2.super_base_blob<256U>.m_data._M_elems[7]);
  auVar5[8] = -(local_98.super_base_blob<256U>.m_data._M_elems[8] ==
               tlc2.super_base_blob<256U>.m_data._M_elems[8]);
  auVar5[9] = -(local_98.super_base_blob<256U>.m_data._M_elems[9] ==
               tlc2.super_base_blob<256U>.m_data._M_elems[9]);
  auVar5[10] = -(local_98.super_base_blob<256U>.m_data._M_elems[10] ==
                tlc2.super_base_blob<256U>.m_data._M_elems[10]);
  auVar5[0xb] = -(local_98.super_base_blob<256U>.m_data._M_elems[0xb] ==
                 tlc2.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar5[0xc] = -(local_98.super_base_blob<256U>.m_data._M_elems[0xc] ==
                 tlc2.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar5[0xd] = -(local_98.super_base_blob<256U>.m_data._M_elems[0xd] ==
                 tlc2.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar5[0xe] = -(local_98.super_base_blob<256U>.m_data._M_elems[0xe] ==
                 tlc2.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar5[0xf] = -(local_98.super_base_blob<256U>.m_data._M_elems[0xf] ==
                 tlc2.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar5 = auVar5 & auVar7;
  local_b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) == 0xffff);
  local_b8.m_message.px = (element_type *)0x0;
  local_b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_c0 = "";
  local_e0 = 0;
  local_e8 = &PTR__lazy_ostream_01389a00;
  local_d8 = boost::unit_test::lazy_ostream::inst;
  local_d0 = &local_f0;
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_01389a00;
  local_100 = boost::unit_test::lazy_ostream::inst;
  local_f8 = &local_118;
  local_f0 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b8,&local_158,1,2,REQUIRE,0xeb07f0,(size_t)&local_c8,0x6bd,&local_e8,"tlc2",
             &local_110);
  boost::detail::shared_count::~shared_count(&local_b8.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(compute_tapleaf)
{
    constexpr uint8_t script[6] = {'f','o','o','b','a','r'};
    constexpr uint256 tlc0{"edbc10c272a1215dcdcc11d605b9027b5ad6ed97cd45521203f136767b5b9c06"};
    constexpr uint256 tlc2{"8b5c4f90ae6bf76e259dbef5d8a59df06359c391b59263741b25eca76451b27a"};

    BOOST_CHECK_EQUAL(ComputeTapleafHash(0xc0, Span(script)), tlc0);
    BOOST_CHECK_EQUAL(ComputeTapleafHash(0xc2, Span(script)), tlc2);
}